

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O3

Type * __thiscall
QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_calendarRegistry>_>::operator->
          (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_calendarRegistry>_>
           *this)

{
  int iVar1;
  
  if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_calendarRegistry>>::
      instance()::holder == '\0') {
    iVar1 = __cxa_guard_acquire(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_calendarRegistry>>
                                 ::instance()::holder);
    if (iVar1 != 0) {
      QtPrivate::QCalendarRegistry::QCalendarRegistry
                ((QCalendarRegistry *)
                 QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_calendarRegistry>>
                 ::instance()::holder);
      QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_calendarRegistry>::guard._q_value.
      super___atomic_base<signed_char>._M_i = (Type)(__atomic_base<signed_char>)0xff;
      __cxa_atexit(QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_calendarRegistry>::~Holder,
                   QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_calendarRegistry>>
                   ::instance()::holder,&__dso_handle);
      __cxa_guard_release(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_calendarRegistry>>
                           ::instance()::holder);
    }
  }
  return (Type *)QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_calendarRegistry>>
                 ::instance()::holder;
}

Assistant:

static Type *instance() noexcept(Holder::ConstructionIsNoexcept)
    {
        static Holder holder;
        return holder.pointer();
    }